

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_resize.cpp
# Opt level: O3

void ncnn::resize_bilinear_c1
               (uchar *src,int srcw,int srch,int srcstride,uchar *dst,int w,int h,int stride)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  float fVar4;
  short *psVar5;
  short b0;
  int iVar6;
  short *rows1p;
  void *pvVar7;
  short *rows1p_00;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  short *psVar14;
  short *rows0p;
  ulong uVar15;
  short *psVar16;
  short *rows0p_00;
  bool bVar17;
  uint uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  Mat local_c8;
  Mat local_78;
  
  uVar2 = (ulong)(uint)w;
  uVar18 = (h + w) * 2;
  uVar15 = 0xffffffffffffffff;
  if (-1 < (int)uVar18) {
    uVar15 = (ulong)uVar18 * 4;
  }
  pvVar7 = operator_new__(uVar15);
  lVar9 = (long)w;
  lVar10 = (long)h;
  if (0 < w) {
    uVar15 = 0;
    do {
      fVar4 = ((float)(int)uVar15 + 0.5) * (float)srcw * (1.0 / (float)w) + -0.5;
      fVar19 = floorf(fVar4);
      iVar6 = (int)fVar19;
      fVar22 = 0.0;
      bVar17 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar17) {
        fVar22 = (fVar4 - (float)(int)fVar19) * 2048.0;
      }
      iVar8 = iVar6;
      if (srcw + -1 <= iVar6) {
        iVar8 = srcw + -2;
      }
      *(int *)((long)pvVar7 + uVar15 * 4) = iVar8;
      if (srcw + -1 <= iVar6) {
        fVar22 = 2048.0;
      }
      uVar18 = -(uint)(0.0 <= 2048.0 - fVar22);
      auVar20._0_4_ = (int)((float)(uVar18 & 0x3f000000 | ~uVar18 & 0xbf000000) + (2048.0 - fVar22))
      ;
      auVar20._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar22) & 0x3f000000 | ~-(uint)(0.0 <= fVar22) & 0xbf000000)
                + fVar22);
      auVar20._8_8_ = 0;
      auVar20 = packssdw(auVar20,auVar20);
      *(int *)((long)pvVar7 + uVar15 * 4 + lVar10 * 4 + lVar9 * 4) = auVar20._0_4_;
      uVar15 = uVar15 + 1;
    } while (uVar2 != uVar15);
  }
  psVar14 = (short *)((long)pvVar7 + lVar10 * 4 + lVar9 * 8);
  if (0 < h) {
    uVar15 = 0;
    do {
      fVar4 = ((float)(int)uVar15 + 0.5) * (float)srch * (1.0 / (float)h) + -0.5;
      fVar19 = floorf(fVar4);
      iVar6 = (int)fVar19;
      fVar22 = 0.0;
      bVar17 = -1 < iVar6;
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (bVar17) {
        fVar22 = (fVar4 - (float)(int)fVar19) * 2048.0;
      }
      iVar8 = iVar6;
      if (srch + -1 <= iVar6) {
        iVar8 = srch + -2;
      }
      *(int *)((long)pvVar7 + uVar15 * 4 + lVar9 * 4) = iVar8;
      if (srch + -1 <= iVar6) {
        fVar22 = 2048.0;
      }
      uVar18 = -(uint)(0.0 <= 2048.0 - fVar22);
      auVar21._0_4_ = (int)((float)(uVar18 & 0x3f000000 | ~uVar18 & 0xbf000000) + (2048.0 - fVar22))
      ;
      auVar21._4_4_ =
           (int)((float)(-(uint)(0.0 <= fVar22) & 0x3f000000 | ~-(uint)(0.0 <= fVar22) & 0xbf000000)
                + fVar22);
      auVar21._8_8_ = 0;
      auVar20 = packssdw(auVar21,auVar21);
      *(int *)(psVar14 + uVar15 * 2) = auVar20._0_4_;
      uVar15 = uVar15 + 1;
    } while ((uint)h != uVar15);
  }
  local_c8.cstep = 0;
  local_c8.data = (short *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Mat::create(&local_c8,w,2,(Allocator *)0x0);
  local_78.cstep = 0;
  local_78.data = (short *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,w,2,(Allocator *)0x0);
  if (0 < h) {
    lVar10 = lVar10 * 4 + lVar9 * 4;
    iVar6 = 0;
    rows1p_00 = (short *)local_78.data;
    psVar16 = (short *)local_c8.data;
    iVar8 = -2;
    do {
      iVar1 = *(int *)((long)pvVar7 + (long)iVar6 * 4 + lVar9 * 4);
      psVar5 = rows1p_00;
      rows0p_00 = psVar16;
      if (iVar1 != iVar8) {
        if (iVar1 == iVar8 + 1) {
          psVar5 = psVar16;
          rows0p_00 = rows1p_00;
          if (0 < w) {
            iVar8 = (iVar1 + 1) * srcstride;
            uVar15 = 0;
            do {
              lVar11 = (long)*(int *)((long)pvVar7 + uVar15 * 4);
              psVar16[uVar15] =
                   (short)((uint)src[lVar11 + (long)iVar8 + 1] *
                           (int)*(short *)((long)pvVar7 + uVar15 * 4 + lVar10 + 2) +
                           (uint)src[lVar11 + iVar8] *
                           (int)*(short *)((long)pvVar7 + uVar15 * 4 + lVar10) >> 4);
              uVar15 = uVar15 + 1;
            } while (uVar2 != uVar15);
          }
        }
        else if (0 < w) {
          iVar8 = (iVar1 + 1) * srcstride;
          uVar15 = 0;
          do {
            lVar11 = (long)*(int *)((long)pvVar7 + uVar15 * 4);
            iVar12 = (int)*(short *)((long)pvVar7 + uVar15 * 4 + lVar10);
            iVar13 = (int)*(short *)((long)pvVar7 + uVar15 * 4 + lVar10 + 2);
            psVar16[uVar15] =
                 (short)((uint)src[lVar11 + (long)(iVar1 * srcstride) + 1] * iVar13 +
                         (uint)src[lVar11 + iVar1 * srcstride] * iVar12 >> 4);
            rows1p_00[uVar15] =
                 (short)((uint)src[lVar11 + (long)iVar8 + 1] * iVar13 +
                         (uint)src[lVar11 + iVar8] * iVar12 >> 4);
            uVar15 = uVar15 + 1;
          } while (uVar2 != uVar15);
        }
      }
      rows1p_00 = psVar5;
      iVar8 = iVar6 + 1;
      if (iVar8 < h) {
        b0 = *psVar14;
        if (*(int *)((long)pvVar7 + (long)iVar8 * 4 + lVar9 * 4) != iVar1) goto LAB_001366f6;
        vresize_two(rows0p_00,rows1p_00,w,dst + iVar6 * stride,dst + iVar8 * stride,b0,psVar14[1],
                    psVar14[2],psVar14[3]);
        psVar14 = psVar14 + 4;
        iVar6 = iVar6 + 2;
      }
      else {
        b0 = *psVar14;
LAB_001366f6:
        vresize_one(rows0p_00,rows1p_00,w,dst + iVar6 * stride,b0,psVar14[1]);
        psVar14 = psVar14 + 2;
        iVar6 = iVar8;
      }
      psVar16 = rows0p_00;
      iVar8 = iVar1;
    } while (iVar6 < h);
  }
  operator_delete__(pvVar7);
  piVar3 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if ((short *)local_78.data != (short *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if ((short *)local_c8.data != (short *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

void resize_bilinear_c1(const unsigned char* src, int srcw, int srch, int srcstride, unsigned char* dst, int w, int h, int stride)
{
    const int INTER_RESIZE_COEF_BITS = 11;
    const int INTER_RESIZE_COEF_SCALE = 1 << INTER_RESIZE_COEF_BITS;

    double scale_x = (double)srcw / w;
    double scale_y = (double)srch / h;

    int* buf = new int[w + h + w + h];

    int* xofs = buf;     //new int[w];
    int* yofs = buf + w; //new int[h];

    short* ialpha = (short*)(buf + w + h);    //new short[w * 2];
    short* ibeta = (short*)(buf + w + h + w); //new short[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

#define SATURATE_CAST_SHORT(X) (short)::std::min(::std::max((int)(X + (X >= 0.f ? 0.5f : -0.5f)), SHRT_MIN), SHRT_MAX);

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = static_cast<int>(floor(fx));
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= srcw - 1)
        {
            sx = srcw - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        float a0 = (1.f - fx) * INTER_RESIZE_COEF_SCALE;
        float a1 = fx * INTER_RESIZE_COEF_SCALE;

        ialpha[dx * 2] = SATURATE_CAST_SHORT(a0);
        ialpha[dx * 2 + 1] = SATURATE_CAST_SHORT(a1);
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = static_cast<int>(floor(fy));
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= srch - 1)
        {
            sy = srch - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        float b0 = (1.f - fy) * INTER_RESIZE_COEF_SCALE;
        float b1 = fy * INTER_RESIZE_COEF_SCALE;

        ibeta[dy * 2] = SATURATE_CAST_SHORT(b0);
        ibeta[dy * 2 + 1] = SATURATE_CAST_SHORT(b1);
    }

#undef SATURATE_CAST_SHORT

    // loop body
    Mat rowsbuf0(w, (size_t)2u);
    Mat rowsbuf1(w, (size_t)2u);
    short* rows0 = (short*)rowsbuf0.data;
    short* rows1 = (short*)rowsbuf1.data;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            short* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S1p = S1 + sx;
                rows1p[dx] = (S1p[0] * a0 + S1p[1] * a1) >> 4;

                ialphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const unsigned char* S0 = src + srcstride * (sy);
            const unsigned char* S1 = src + srcstride * (sy + 1);

            const short* ialphap = ialpha;
            short* rows0p = rows0;
            short* rows1p = rows1;
            for (int dx = 0; dx < w; dx++)
            {
                sx = xofs[dx];
                short a0 = ialphap[0];
                short a1 = ialphap[1];

                const unsigned char* S0p = S0 + sx;
                const unsigned char* S1p = S1 + sx;
                rows0p[dx] = (S0p[0] * a0 + S0p[1] * a1) >> 4;
                rows1p[dx] = (S1p[0] * a0 + S1p[1] * a1) >> 4;

                ialphap += 2;
            }
        }

        prev_sy1 = sy;

        if (dy + 1 < h && yofs[dy + 1] == sy)
        {
            // vresize for two rows
            unsigned char* Dp0 = dst + stride * dy;
            unsigned char* Dp1 = dst + stride * (dy + 1);

            vresize_two(rows0, rows1, w, Dp0, Dp1, ibeta[0], ibeta[1], ibeta[2], ibeta[3]);

            ibeta += 4;
            dy += 1;
        }
        else
        {
            // vresize
            unsigned char* Dp = dst + stride * dy;

            vresize_one(rows0, rows1, w, Dp, ibeta[0], ibeta[1]);

            ibeta += 2;
        }
    }

    delete[] buf;
}